

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

bool cmState::IsCacheEntryType(string *key)

{
  pointer __s1;
  size_t __n;
  int iVar1;
  bool bVar2;
  
  __s1 = (key->_M_dataplus)._M_p;
  __n = key->_M_string_length;
  if (cmCacheEntryTypes_abi_cxx11_._M_elems[0]._M_string_length == __n) {
    if (__n == 0) {
      return true;
    }
    iVar1 = bcmp(__s1,cmCacheEntryTypes_abi_cxx11_._M_elems[0]._M_dataplus._M_p,__n);
    if (iVar1 == 0) {
      return true;
    }
    if (cmCacheEntryTypes_abi_cxx11_._M_elems[1]._M_string_length == __n) {
LAB_00167489:
      iVar1 = bcmp(__s1,cmCacheEntryTypes_abi_cxx11_._M_elems[1]._M_dataplus._M_p,__n);
      if (iVar1 == 0) goto LAB_0016758a;
    }
LAB_001674a3:
    if (cmCacheEntryTypes_abi_cxx11_._M_elems[2]._M_string_length == __n) {
      if (__n == 0) {
        return true;
      }
      iVar1 = bcmp(__s1,cmCacheEntryTypes_abi_cxx11_._M_elems[2]._M_dataplus._M_p,__n);
      if (iVar1 == 0) {
        return true;
      }
      if (cmCacheEntryTypes_abi_cxx11_._M_elems[3]._M_string_length == __n) {
LAB_001674ef:
        iVar1 = bcmp(__s1,cmCacheEntryTypes_abi_cxx11_._M_elems[3]._M_dataplus._M_p,__n);
        if (iVar1 == 0) goto LAB_0016758a;
      }
    }
    else if (cmCacheEntryTypes_abi_cxx11_._M_elems[3]._M_string_length == __n) {
      if (__n != 0) goto LAB_001674ef;
      goto LAB_0016758a;
    }
    if (cmCacheEntryTypes_abi_cxx11_._M_elems[4]._M_string_length == __n) {
      if (__n == 0) {
        return true;
      }
      iVar1 = bcmp(__s1,cmCacheEntryTypes_abi_cxx11_._M_elems[4]._M_dataplus._M_p,__n);
      if (iVar1 == 0) {
        return true;
      }
      if (cmCacheEntryTypes_abi_cxx11_._M_elems[5]._M_string_length == __n) {
LAB_00167549:
        iVar1 = bcmp(__s1,cmCacheEntryTypes_abi_cxx11_._M_elems[5]._M_dataplus._M_p,__n);
        if (iVar1 == 0) goto LAB_0016758a;
      }
    }
    else if (cmCacheEntryTypes_abi_cxx11_._M_elems[5]._M_string_length == __n) {
      if (__n != 0) goto LAB_00167549;
      goto LAB_0016758a;
    }
    if ((cmCacheEntryTypes_abi_cxx11_._M_elems[6]._M_string_length != __n) ||
       ((bVar2 = true, __n != 0 &&
        (iVar1 = bcmp(__s1,cmCacheEntryTypes_abi_cxx11_._M_elems[6]._M_dataplus._M_p,__n),
        iVar1 != 0)))) {
      bVar2 = false;
    }
  }
  else {
    if (cmCacheEntryTypes_abi_cxx11_._M_elems[1]._M_string_length != __n) goto LAB_001674a3;
    if (__n != 0) goto LAB_00167489;
LAB_0016758a:
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool cmState::IsCacheEntryType(std::string const& key)
{
  return std::any_of(
    cmCacheEntryTypes.begin(), cmCacheEntryTypes.end(),
    [&key](std::string const& i) -> bool { return key == i; });
}